

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::ElementWidth(Type *type)

{
  int iVar1;
  undefined4 extraout_var;
  Type *type_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Float *float_type;
  Vector *vec_type;
  Type *type_local;
  
  iVar1 = (*type->_vptr_Type[0xe])();
  if ((Vector *)CONCAT44(extraout_var,iVar1) == (Vector *)0x0) {
    iVar1 = (*type->_vptr_Type[0xc])();
    if ((Float *)CONCAT44(extraout_var_00,iVar1) == (Float *)0x0) {
      iVar1 = (*type->_vptr_Type[10])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        __assert_fail("type->AsInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x55,
                      "uint32_t spvtools::opt::(anonymous namespace)::ElementWidth(const analysis::Type *)"
                     );
      }
      iVar1 = (*type->_vptr_Type[10])();
      type_local._4_4_ = analysis::Integer::width((Integer *)CONCAT44(extraout_var_02,iVar1));
    }
    else {
      type_local._4_4_ = analysis::Float::width((Float *)CONCAT44(extraout_var_00,iVar1));
    }
  }
  else {
    type_00 = analysis::Vector::element_type((Vector *)CONCAT44(extraout_var,iVar1));
    type_local._4_4_ = ElementWidth(type_00);
  }
  return type_local._4_4_;
}

Assistant:

uint32_t ElementWidth(const analysis::Type* type) {
  if (const analysis::Vector* vec_type = type->AsVector()) {
    return ElementWidth(vec_type->element_type());
  } else if (const analysis::Float* float_type = type->AsFloat()) {
    return float_type->width();
  } else {
    assert(type->AsInteger());
    return type->AsInteger()->width();
  }
}